

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O2

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemFormatsSink::put
          (AppendItemFormatsSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UnicodeString *__return_storage_ptr__;
  UBool UVar1;
  UDateTimePatternField field;
  undefined7 in_register_00000009;
  int32_t i;
  int i_00;
  DateTimePatternGenerator *this_00;
  ResourceTable itemsTable;
  char *local_a8;
  AppendItemFormatsSink *local_a0;
  undefined1 local_98 [48];
  ushort local_68;
  
  local_a8 = key;
  local_a0 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (local_98,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = 0;
    __return_storage_ptr__ = (UnicodeString *)(local_98 + 0x28);
    while( true ) {
      this_00 = (DateTimePatternGenerator *)local_98;
      UVar1 = ResourceTable::getKeyAndValue((ResourceTable *)this_00,i_00,&local_a8,value);
      if (UVar1 == '\0') break;
      field = getAppendFormatNumber(this_00,local_a8);
      if (field != UDATPG_FIELD_COUNT) {
        ResourceValue::getUnicodeString(__return_storage_ptr__,value,errorCode);
        if ((*(ushort *)(&local_a0->dtpg->field_0x110 + (ulong)field * 0x40) < 0x20) &&
           (0x1f < local_68)) {
          setAppendItemFormat(local_a0->dtpg,field,__return_storage_ptr__);
        }
        icu_63::UnicodeString::~UnicodeString(__return_storage_ptr__);
      }
      i_00 = i_00 + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable itemsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; itemsTable.getKeyAndValue(i, key, value); ++i) {
            UDateTimePatternField field = dtpg.getAppendFormatNumber(key);
            if (field == UDATPG_FIELD_COUNT) { continue; }
            const UnicodeString& valueStr = value.getUnicodeString(errorCode);
            if (dtpg.getAppendItemFormat(field).isEmpty() && !valueStr.isEmpty()) {
                dtpg.setAppendItemFormat(field, valueStr);
            }
        }
    }